

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86.cpp
# Opt level: O2

int __thiscall ncnn::Bias_x86::forward_inplace(Bias_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  Mat local_78;
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  lVar2 = *(long *)(&this->field_0xd8 + (long)this->_vptr_Bias_x86[-3]);
  uVar9 = 0;
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar9;
  }
  for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    Mat::channel(&local_78,bottom_top_blob,(int)uVar9);
    pvVar3 = local_78.data;
    Mat::~Mat(&local_78);
    fVar1 = *(float *)(lVar2 + uVar9 * 4);
    lVar4 = 0;
    pfVar6 = (float *)pvVar3;
    for (iVar5 = 0; iVar5 + 3 < iVar7; iVar5 = iVar5 + 4) {
      *pfVar6 = *pfVar6 + fVar1;
      pfVar6[1] = pfVar6[1] + fVar1;
      pfVar6[2] = pfVar6[2] + fVar1;
      pfVar6[3] = pfVar6[3] + fVar1;
      pfVar6 = pfVar6 + 4;
      lVar4 = lVar4 + 4;
    }
    for (; (int)lVar4 < iVar7; lVar4 = lVar4 + 1) {
      *(float *)((long)pvVar3 + lVar4 * 4) = *(float *)((long)pvVar3 + lVar4 * 4) + fVar1;
    }
  }
  return 0;
}

Assistant:

int Bias_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}